

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O2

long Centaurus::Context<char>::callback
               (SymbolEntry *symbol,uint64_t *values,int num_values,void *context)

{
  code *pcVar1;
  long lVar2;
  SymbolContext<char> rc;
  void *local_20;
  SymbolEntry *local_18;
  uint64_t *local_10;
  int local_8;
  
  lVar2 = **context;
  if (((ulong)symbol->id < (ulong)((*context)[1] - lVar2 >> 3)) &&
     (pcVar1 = *(code **)(lVar2 + symbol->id * 8), pcVar1 != (code *)0x0)) {
    local_20 = context;
    local_18 = symbol;
    local_10 = values;
    local_8 = num_values;
    lVar2 = (*pcVar1)(&local_20);
  }
  else {
    lVar2 = 0;
  }
  return lVar2;
}

Assistant:

static long CENTAURUS_CALLBACK callback(const SymbolEntry *symbol, uint64_t *values, int num_values, void *context)
  {
    auto& ctx = *reinterpret_cast<ParseContext<TCHAR>*>(context);
    SymbolContext<TCHAR> rc(ctx, *symbol, values, num_values);
    if (symbol->id < ctx.m_callbacks.size() &&
        ctx.m_callbacks[symbol->id] != nullptr)
      return (long)ctx.m_callbacks[symbol->id](rc);
    return 0;
  }